

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

void __thiscall
helics::TimeDependencies::removeDependency(TimeDependencies *this,GlobalFederateId gid)

{
  pointer __src;
  difference_type __d;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pDVar4;
  pointer __dest;
  
  __dest = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (long)pDVar4 - (long)__dest) {
    uVar3 = ((ulong)((long)pDVar4 - (long)__dest) >> 3) * 0x2e8ba2e8ba2e8ba3;
    do {
      uVar1 = uVar3 >> 1;
      uVar2 = uVar1;
      if (__dest[uVar1].fedID.gid < gid.gid) {
        uVar2 = ~uVar1 + uVar3;
        __dest = __dest + uVar1 + 1;
      }
      uVar3 = uVar2;
    } while (0 < (long)uVar2);
  }
  if (((__dest != pDVar4) && ((__dest->fedID).gid == gid.gid)) &&
     (__dest->dependency = false, __dest->dependent == false)) {
    __src = __dest + 1;
    if (__src != pDVar4) {
      memmove(__dest,__src,(long)pDVar4 - (long)__src);
      pDVar4 = (this->dependencies).
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    (this->dependencies).
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = pDVar4 + -1;
  }
  return;
}

Assistant:

void TimeDependencies::removeDependency(GlobalFederateId gid)
{
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep != dependencies.end()) {
        if (dep->fedID == gid) {
            dep->dependency = false;
            if (!dep->dependent) {
                dependencies.erase(dep);
            }
        }
    }
}